

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  bool bVar1;
  pointer pcVar2;
  reference pbVar3;
  ostream *poVar4;
  string *psVar5;
  string local_328;
  reference local_308;
  SaveCacheEntry *i_1;
  iterator __end1;
  iterator __begin1;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *__range1;
  string local_2e0;
  cmValue local_2c0;
  cmValue help;
  cmValue existingValue;
  undefined1 local_2a0 [8];
  SaveCacheEntry save;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  iterator i;
  ostringstream warning;
  undefined1 local_b0 [8];
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  cmList argsSplit;
  string *var_local;
  cmake *this_local;
  
  argsSplit.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = var;
  cmList::cmList((cmList *)local_38,var,Yes);
  pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"",
             (allocator<char> *)
             ((long)&saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmState::SetGlobalProperty(pcVar2,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = GetIsInTryCompile(this);
  if (bVar1) {
    this_local._4_4_ = 0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::vector
              ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
    std::operator<<((ostream *)&i,
                    "You have changed variables that require your cache to be deleted.\nConfigure will be re-run and you may have to reset some variables.\nThe following variables have changed:\n"
                   );
    local_230._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmList::begin_abi_cxx11_((cmList *)local_38);
    while( true ) {
      save._96_8_ = cmList::end_abi_cxx11_((cmList *)local_38);
      bVar1 = __gnu_cxx::operator!=
                        (&local_230,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&save.type);
      if (!bVar1) break;
      SaveCacheEntry::SaveCacheEntry((SaveCacheEntry *)local_2a0);
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_230);
      std::__cxx11::string::operator=((string *)local_2a0,(string *)pbVar3);
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_230);
      poVar4 = std::operator<<((ostream *)&i,(string *)pbVar3);
      std::operator<<(poVar4,"= ");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_230,0);
      existingValue.Value = (string *)cmList::end_abi_cxx11_((cmList *)local_38);
      bVar1 = __gnu_cxx::operator!=
                        (&local_230,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&existingValue);
      if (bVar1) {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_230);
        std::__cxx11::string::operator=
                  ((string *)(save.key.field_2._M_local_buf + 8),(string *)pbVar3);
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_230);
        poVar4 = std::operator<<((ostream *)&i,(string *)pbVar3);
        std::operator<<(poVar4,'\n');
      }
      else {
        std::operator<<((ostream *)&i,'\n');
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator-=(&local_230,1);
      }
      pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      help = cmState::GetCacheEntryValue(pcVar2,(string *)local_2a0);
      bVar1 = cmValue::operator_cast_to_bool(&help);
      if (bVar1) {
        pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        save.help.field_2._8_4_ = cmState::GetCacheEntryType(pcVar2,(string *)local_2a0);
        pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"HELPSTRING",(allocator<char> *)((long)&__range1 + 7));
        local_2c0 = cmState::GetCacheEntryProperty(pcVar2,(string *)local_2a0,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        bVar1 = cmValue::operator_cast_to_bool(&local_2c0);
        if (bVar1) {
          psVar5 = cmValue::operator*[abi_cxx11_(&local_2c0);
          std::__cxx11::string::operator=
                    ((string *)(save.value.field_2._M_local_buf + 8),(string *)psVar5);
        }
      }
      else {
        save.help.field_2._8_4_ = 6;
      }
      std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::push_back
                ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_b0,
                 (value_type *)local_2a0);
      SaveCacheEntry::~SaveCacheEntry((SaveCacheEntry *)local_2a0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_230);
    }
    psVar5 = GetHomeOutputDirectory_abi_cxx11_(this);
    DeleteCache(this,psVar5);
    LoadCache(this);
    __end1 = std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::begin
                       ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_b0);
    i_1 = (SaveCacheEntry *)
          std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::end
                    ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_b0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
                                       *)&i_1), bVar1) {
      local_308 = __gnu_cxx::
                  __normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
                  ::operator*(&__end1);
      AddCacheEntry(this,&local_308->key,&local_308->value,&local_308->help,local_308->type);
      __gnu_cxx::
      __normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::ostringstream::str();
    cmSystemTools::Message(&local_328,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_328);
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = Configure(this);
    }
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector
              ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_b0);
  }
  cmList::~cmList((cmList *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  cmList argsSplit{ var, cmList::EmptyElements::Yes };
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  warning
    << "You have changed variables that require your cache to be deleted.\n"
       "Configure will be re-run and you may have to reset some variables.\n"
       "The following variables have changed:\n";
  for (auto i = argsSplit.begin(); i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    if (i != argsSplit.end()) {
      save.value = *i;
      warning << *i << '\n';
    } else {
      warning << '\n';
      i -= 1;
    }
    cmValue existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (cmValue help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = *help;
      }
    } else {
      save.type = cmStateEnums::CacheEntryType::UNINITIALIZED;
    }
    saved.push_back(std::move(save));
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (SaveCacheEntry const& i : saved) {
    this->AddCacheEntry(i.key, i.value, i.help, i.type);
  }
  cmSystemTools::Message(warning.str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccurredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}